

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastSqrtNR(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  ulong uVar5;
  int Lit;
  uint nSize;
  long lVar6;
  ulong uVar7;
  int Carry;
  int *local_68;
  long local_60;
  int *local_58;
  Vec_Int_t *local_50;
  int *local_48;
  ulong local_40;
  int *local_38;
  
  Carry = 1;
  local_48 = pNum;
  if ((nNum & 1U) != 0) {
    __assert_fail("nNum % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                  ,0x31a,"void Wlc_BlastSqrtNR(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)");
  }
  nSize = nNum >> 1;
  uVar5 = 0;
  Vec_IntFill(vRes,nSize,0);
  Vec_IntFill(vTmp,nNum * 2,0);
  local_58 = vRes->pArray;
  local_68 = vTmp->pArray;
  local_60 = (long)nNum;
  piVar1 = local_68 + local_60;
  local_40 = (ulong)nSize;
  if ((int)nSize < 1) {
    local_40 = uVar5;
  }
  piVar4 = piVar1;
  local_50 = vRes;
  Lit = 1;
  while( true ) {
    if (uVar5 == local_40) {
      Vec_IntReverseOrder(local_50);
      return;
    }
    if (*piVar1 != 0) break;
    for (uVar3 = 1; uVar3 < uVar5; uVar3 = uVar3 + 1) {
      piVar1[uVar3] = 0;
    }
    uVar3 = uVar5 * 2;
    for (lVar6 = 0; uVar5 + lVar6 < uVar3; lVar6 = lVar6 + 1) {
      piVar4[lVar6] = local_58[lVar6];
    }
    local_38 = piVar4;
    iVar2 = Abc_LitNot(Lit);
    uVar7 = (ulong)(uint)((int)lVar6 + (int)uVar5);
    piVar1[uVar7] = iVar2;
    piVar1[uVar7 + 1] = 1;
    if (uVar7 != uVar3) {
      __assert_fail("k == 2*i+2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                    ,0x32a,"void Wlc_BlastSqrtNR(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    lVar6 = local_60 + uVar5 * -2;
    local_68[uVar5 * 2] = local_48[lVar6 + -1];
    local_68[uVar5 * 2 + 1] = local_48[lVar6 + -2];
    for (uVar3 = uVar3 | 1; -1 < (int)uVar3; uVar3 = (ulong)((int)uVar3 - 1)) {
      iVar2 = Gia_ManHashXor(pNew,Lit,piVar1[uVar3 & 0xffffffff]);
      Wlc_BlastFullAdder(pNew,iVar2,local_68[uVar3 & 0xffffffff],Carry,&Carry,
                         local_68 + (uVar3 & 0xffffffff));
    }
    local_58[uVar5] = Carry;
    uVar5 = uVar5 + 1;
    piVar4 = local_38 + 1;
    Lit = Carry;
  }
  __assert_fail("pIn1[0] == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                ,0x323,"void Wlc_BlastSqrtNR(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Wlc_BlastSqrtNR( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    int * pSqr, * pRem, * pIn1;
    int i, k, Carry = 1;
    assert( nNum % 2 == 0 );
    Vec_IntFill( vRes, nNum/2, 0 );
    Vec_IntFill( vTmp, 2*nNum, 0 );
    pSqr = Vec_IntArray( vRes );
    pRem = Vec_IntArray( vTmp );
    pIn1 = pRem + nNum;
    for ( i = 0; i < nNum/2; i++ )
    {
        int SqrPrev = Carry;
        assert( pIn1[0] == 0 );
        for ( k = 1; k < i; k++ )
            pIn1[k] = 0;
        for ( k = i; k < 2*i; k++ )
            pIn1[k] = pSqr[k-i];
        pIn1[k++] = Abc_LitNot(Carry);
        pIn1[k++] = 1;
        assert( k == 2*i+2 );
        pRem[2*i+0] = pNum[nNum-2*i-1];
        pRem[2*i+1] = pNum[nNum-2*i-2];
        for ( k = 2*i+1; k >= 0; k-- )
            Wlc_BlastFullAdder( pNew, Gia_ManHashXor(pNew, SqrPrev, pIn1[k]), pRem[k], Carry, &Carry, &pRem[k] );
        pSqr[i] = Carry;
    }
    Vec_IntReverseOrder( vRes );
}